

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O1

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxIkLink[]>(mmd *this,size_t n)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  
  puVar1 = (undefined4 *)operator_new__(-(ulong)(n >> 0x3b != 0) | n * 0x20);
  if (n != 0) {
    puVar2 = puVar1;
    do {
      *puVar2 = 0;
      *(undefined1 *)(puVar2 + 1) = 0;
      *(undefined8 *)(puVar2 + 2) = 0;
      *(undefined8 *)(puVar2 + 4) = 0;
      *(undefined8 *)(puVar2 + 6) = 0;
      puVar2 = puVar2 + 8;
    } while (puVar2 != puVar1 + n * 8);
  }
  *(undefined4 **)this = puVar1;
  return (__uniq_ptr_data<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }